

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  polyprediction *a_s;
  v_array<char> *pvVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  pointer ppeVar6;
  example *ec;
  int *piVar7;
  _func_void_int_string_v_array<char> *p_Var8;
  v_array<char> vVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  ostream *poVar13;
  int *piVar14;
  long lVar15;
  pointer ppeVar16;
  ulong uVar17;
  float *pfVar18;
  undefined1 in_stack_fffffffffffffdc8 [12];
  float in_stack_fffffffffffffdd4;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar4 = (head_ec->l).cs.costs._begin;
  pwVar5 = (head_ec->l).cs.costs._end;
  iVar12 = example_is_newline(head_ec);
  if (iVar12 == 0) {
    bVar10 = ec_is_label_definition(head_ec);
    if (!bVar10) {
      puVar1 = &all->sd->total_features;
      *puVar1 = *puVar1 + head_ec->num_features;
      ppVar2 = &head_ec->l;
      a_s = &head_ec->pred;
      cVar11 = (*(code *)PTR_test_label_002c3b40)();
      if (cVar11 == '\0') {
        ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        in_stack_fffffffffffffdd4 = 0.0;
        uVar17 = 0;
        for (ppeVar16 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start; ppeVar16 != ppeVar6;
            ppeVar16 = ppeVar16 + 1) {
          ec = *ppeVar16;
          bVar10 = COST_SENSITIVE::ec_is_example_header(ec);
          if (!bVar10) {
            if (*hit_loss != false) break;
            if (uVar17 == ((a_s->a_s)._begin)->action) {
              in_stack_fffffffffffffdd4 = ((ec->l).cs.costs._begin)->x;
              *hit_loss = true;
            }
            uVar17 = uVar17 + 1;
          }
        }
        all->sd->sum_loss = all->sd->sum_loss + (double)in_stack_fffffffffffffdd4;
        all->sd->sum_loss_since_last_dump =
             (double)in_stack_fffffffffffffdd4 + all->sd->sum_loss_since_last_dump;
      }
      piVar7 = (all->final_prediction_sink)._end;
      pvVar3 = &head_ec->tag;
      for (piVar14 = (all->final_prediction_sink)._begin; piVar14 != piVar7; piVar14 = piVar14 + 1)
      {
        ACTION_SCORE::print_action_score
                  (*piVar14,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar3);
      }
      if (0 < all->raw_prediction) {
        outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
        outputString._M_string_length = 0;
        outputString.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
        pfVar18 = &pwVar4->partial_prediction;
        for (lVar15 = 0; (long)pwVar5 - (long)pwVar4 >> 4 != lVar15; lVar15 = lVar15 + 1) {
          if (lVar15 != 0) {
            std::operator<<(&local_1a8,' ');
          }
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          poVar13 = std::operator<<(poVar13,':');
          std::ostream::operator<<(poVar13,*pfVar18);
          pfVar18 = pfVar18 + 4;
        }
        p_Var8 = all->print_text;
        iVar12 = all->raw_prediction;
        std::__cxx11::stringbuf::str();
        vVar9._end._4_4_ = in_stack_fffffffffffffdd4;
        vVar9._0_12_ = in_stack_fffffffffffffdc8;
        vVar9.end_array = (char *)all;
        vVar9.erase_count = (size_t)head_ec;
        (*p_Var8)(iVar12,(string)*pvVar3,vVar9);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
        std::__cxx11::string::~string((string *)&outputString);
      }
      bVar10 = (bool)(*(code *)PTR_test_label_002c3b40)(ppVar2);
      COST_SENSITIVE::print_update(all,bVar10,head_ec,ec_seq,true,0);
    }
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (ec_is_example_header(*ex))
        continue;
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}